

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

NeuralNetwork * __thiscall CoreML::Specification::Model::mutable_neuralnetwork(Model *this)

{
  NeuralNetwork *this_00;
  
  if (this->_oneof_case_[0] == 500) {
    this_00 = (NeuralNetwork *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 500;
    this_00 = (NeuralNetwork *)operator_new(0x58);
    NeuralNetwork::NeuralNetwork(this_00);
    (this->Type_).neuralnetwork_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::NeuralNetwork* Model::mutable_neuralnetwork() {
  if (!has_neuralnetwork()) {
    clear_Type();
    set_has_neuralnetwork();
    Type_.neuralnetwork_ = new ::CoreML::Specification::NeuralNetwork;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.neuralNetwork)
  return Type_.neuralnetwork_;
}